

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v1.cpp
# Opt level: O0

ssize_t __thiscall
LASreadItemCompressed_RGB12_v1::read
          (LASreadItemCompressed_RGB12_v1 *this,int __fd,void *__buf,size_t __nbytes)

{
  U8 *pUVar1;
  U32 UVar2;
  I32 IVar3;
  uint uVar4;
  undefined4 in_register_00000034;
  ushort *puVar5;
  U32 sym;
  U32 *context_local;
  U8 *item_local;
  LASreadItemCompressed_RGB12_v1 *this_local;
  
  puVar5 = (ushort *)CONCAT44(in_register_00000034,__fd);
  UVar2 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_byte_used);
  if ((UVar2 & 1) == 0) {
    *puVar5 = *(ushort *)this->last_item & 0xff;
  }
  else {
    IVar3 = IntegerCompressor::decompress(this->ic_rgb,*(ushort *)this->last_item & 0xff,0);
    *puVar5 = (ushort)IVar3;
  }
  if ((UVar2 & 2) == 0) {
    *puVar5 = *puVar5 | *(ushort *)this->last_item & 0xff00;
  }
  else {
    uVar4 = IntegerCompressor::decompress(this->ic_rgb,(int)(uint)*(ushort *)this->last_item >> 8,1)
    ;
    *puVar5 = *puVar5 | (ushort)((uVar4 & 0xffff) << 8);
  }
  if ((UVar2 & 4) == 0) {
    puVar5[1] = *(ushort *)(this->last_item + 2) & 0xff;
  }
  else {
    IVar3 = IntegerCompressor::decompress(this->ic_rgb,*(ushort *)(this->last_item + 2) & 0xff,2);
    puVar5[1] = (ushort)IVar3;
  }
  if ((UVar2 & 8) == 0) {
    puVar5[1] = puVar5[1] | *(ushort *)(this->last_item + 2) & 0xff00;
  }
  else {
    uVar4 = IntegerCompressor::decompress
                      (this->ic_rgb,(int)(uint)*(ushort *)(this->last_item + 2) >> 8,3);
    puVar5[1] = puVar5[1] | (ushort)((uVar4 & 0xffff) << 8);
  }
  if ((UVar2 & 0x10) == 0) {
    puVar5[2] = *(ushort *)(this->last_item + 4) & 0xff;
  }
  else {
    IVar3 = IntegerCompressor::decompress(this->ic_rgb,*(ushort *)(this->last_item + 4) & 0xff,4);
    puVar5[2] = (ushort)IVar3;
  }
  if ((UVar2 & 0x20) == 0) {
    puVar5[2] = puVar5[2] | *(ushort *)(this->last_item + 4) & 0xff00;
  }
  else {
    uVar4 = IntegerCompressor::decompress
                      (this->ic_rgb,(int)(uint)*(ushort *)(this->last_item + 4) >> 8,5);
    puVar5[2] = puVar5[2] | (ushort)((uVar4 & 0xffff) << 8);
  }
  pUVar1 = this->last_item;
  *(undefined4 *)pUVar1 = *(undefined4 *)puVar5;
  *(ushort *)(pUVar1 + 4) = puVar5[2];
  return (ssize_t)pUVar1;
}

Assistant:

inline void LASreadItemCompressed_RGB12_v1::read(U8* item, U32& context)
{
  U32 sym = dec->decodeSymbol(m_byte_used);
  if (sym & (1 << 0)) ((U16*)item)[0] = (U16)ic_rgb->decompress(((U16*)last_item)[0]&255, 0);
  else ((U16*)item)[0] = (U16)(((U16*)last_item)[0]&0xFF);
  if (sym & (1 << 1)) ((U16*)item)[0] |= (((U16)ic_rgb->decompress(((U16*)last_item)[0]>>8, 1)) << 8);
  else ((U16*)item)[0] |= (((U16*)last_item)[0]&0xFF00);
  if (sym & (1 << 2)) ((U16*)item)[1] = (U16)ic_rgb->decompress(((U16*)last_item)[1]&255, 2);
  else ((U16*)item)[1] = (U16)(((U16*)last_item)[1]&0xFF);
  if (sym & (1 << 3)) ((U16*)item)[1] |= (((U16)ic_rgb->decompress(((U16*)last_item)[1]>>8, 3)) << 8);
  else ((U16*)item)[1] |= (((U16*)last_item)[1]&0xFF00);
  if (sym & (1 << 4)) ((U16*)item)[2] = (U16)ic_rgb->decompress(((U16*)last_item)[2]&255, 4);
  else ((U16*)item)[2] = (U16)(((U16*)last_item)[2]&0xFF);
  if (sym & (1 << 5)) ((U16*)item)[2] |= (((U16)ic_rgb->decompress(((U16*)last_item)[2]>>8, 5)) << 8);
  else ((U16*)item)[2] |= (((U16*)last_item)[2]&0xFF00);
  memcpy(last_item, item, 6);
}